

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_emptyConnectionWithId_Test::~Parser_emptyConnectionWithId_Test
          (Parser_emptyConnectionWithId_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, emptyConnectionWithId)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <connection id=\"myId\"/>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues = {
        "Connection in model 'model_name' does not specify a component_1 in a connection element.",
        "Connection in model 'model_name' does not specify a component_2 in a connection element.",
        "Connection in model 'model_name' has an identifier of 'myId' but does not contain any 'map_variables' elements. The connection will be disregarded and the associated identifier will be lost.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}